

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::groebnerRow12_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double factor;
  Index in_stack_ffffffffffffff18;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *in_stack_ffffffffffffff20;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x955de0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955e01);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955e2e);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955e5c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955e80);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pSVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar16,auVar28);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955ed6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955efa);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pSVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar17,auVar29);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955f50);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955f74);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pSVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar18,auVar30);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955fca);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x955fee);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *pSVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar19,auVar31);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x956044);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x956068);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar20,auVar32);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9560be);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9560e2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *pSVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar21,auVar33);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x956138);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x95615c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pSVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar22,auVar34);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9561b5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9561dc);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pSVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar23,auVar35);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x95623b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x956262);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pSVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar24,auVar36);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9562c1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9562e8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar25,auVar37);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x956347);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x95636e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pSVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar26,auVar38);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9563cd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff18,0x9563f4);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pSVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar27,auVar39);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow12_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,19) / groebnerMatrix(12,19);
  groebnerMatrix(targetRow,19) = 0.0;
  groebnerMatrix(targetRow,20) -= factor * groebnerMatrix(12,20);
  groebnerMatrix(targetRow,21) -= factor * groebnerMatrix(12,21);
  groebnerMatrix(targetRow,27) -= factor * groebnerMatrix(12,27);
  groebnerMatrix(targetRow,28) -= factor * groebnerMatrix(12,28);
  groebnerMatrix(targetRow,29) -= factor * groebnerMatrix(12,29);
  groebnerMatrix(targetRow,30) -= factor * groebnerMatrix(12,30);
  groebnerMatrix(targetRow,31) -= factor * groebnerMatrix(12,31);
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(12,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(12,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(12,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(12,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(12,36);
}